

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

void __thiscall
LoaderLogger::AddLogRecorderForXrInstance
          (LoaderLogger *this,XrInstance instance,
          unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder)

{
  mapped_type *this_00;
  pointer this_01;
  uint64_t local_48 [3];
  undefined1 local_30 [8];
  unique_lock<std::shared_timed_mutex> lock;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder_local;
  XrInstance instance_local;
  LoaderLogger *this_local;
  
  lock._8_8_ = recorder;
  recorder_local =
       (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)instance;
  instance_local = (XrInstance)this;
  std::unique_lock<std::shared_timed_mutex>::unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_30,&this->_mutex);
  this_00 = std::
            unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::operator[](&this->_recordersByInstance,(key_type *)&recorder_local);
  this_01 = std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>::operator->
                      ((unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                       lock._8_8_);
  local_48[0] = LoaderLogRecorder::UniqueId(this_01);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::insert(this_00,local_48);
  std::
  vector<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>,std::allocator<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>>
  ::emplace_back<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>
            ((vector<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>,std::allocator<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>>
              *)&this->_recorders,
             (unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)lock._8_8_);
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_30);
  return;
}

Assistant:

void LoaderLogger::AddLogRecorderForXrInstance(XrInstance instance, std::unique_ptr<LoaderLogRecorder>&& recorder) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    _recordersByInstance[instance].insert(recorder->UniqueId());
    _recorders.emplace_back(std::move(recorder));
}